

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O3

void __thiscall
database::Container::_SelectRawDataSetWithCriteria
          (Container *this,impl_filter_type *filter_criteria,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dataset,function<void_(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_&)>
                   *lambda)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long *plVar4;
  bool bVar5;
  pointer pbVar6;
  const_iterator cVar7;
  _Rb_tree_node_base *p_Var8;
  mapped_type *this_00;
  runtime_error *this_01;
  long lVar9;
  long *plVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  required_columns;
  vector<unsigned_long,_std::allocator<unsigned_long>_> primary_index_vector;
  impl_dataset_type result;
  value_type column;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  ComparableString local_120;
  _Rb_tree_color local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  long *local_d8;
  long *plStack_d0;
  long local_c8;
  _Any_data *local_b8;
  impl_schema_type *local_b0;
  pointer local_a8;
  pointer local_a0;
  undefined1 local_98 [16];
  _Base_ptr local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  size_t local_70;
  vector<database::ComparableString,_std::allocator<database::ComparableString>_> local_68;
  vector<database::ComparableString,_std::allocator<database::ComparableString>_> local_48;
  
  bVar5 = _IsValidFilterCriteriaForRawSelection(this,filter_criteria);
  if (bVar5) {
    bVar5 = _IsValidDataSetRequested(this,dataset);
    if (bVar5) {
      local_98._8_8_ = &local_d8;
      local_d8 = (long *)0x0;
      plStack_d0 = (long *)0x0;
      local_c8 = 0;
      local_80 = (_Base_ptr)
                 std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Container.cpp:151:38)>
                 ::_M_invoke;
      local_88 = (_Base_ptr)
                 std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/src/Container.cpp:151:38)>
                 ::_M_manager;
      local_98._0_8_ = this;
      _for_each_criteria(filter_criteria,
                         (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>)>
                          *)local_98);
      if (local_88 != (_Base_ptr)0x0) {
        (*(code *)local_88)(local_98,local_98,3);
      }
      local_80 = (_Base_ptr)(local_98 + 8);
      local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
      local_88 = (_Base_ptr)0x0;
      local_70 = 0;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8 = (_Any_data *)lambda;
      local_78 = local_80;
      if ((dataset->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start ==
          (dataset->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        p_Var8 = (this->m_schema)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(this->m_schema)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var8 != p_Var1) {
          paVar2 = &local_120.m_string.field_2;
          do {
            local_120.m_string._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_120,*(long *)(p_Var8 + 1),
                       (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
            local_100 = p_Var8[2]._M_color;
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,local_120.m_string._M_dataplus._M_p,
                       local_120.m_string._M_dataplus._M_p + local_120.m_string._M_string_length);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_f8,&local_140);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120.m_string._M_dataplus._M_p != paVar2) {
              operator_delete(local_120.m_string._M_dataplus._M_p,
                              local_120.m_string.field_2._M_allocated_capacity + 1);
            }
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          } while ((_Rb_tree_header *)p_Var8 != p_Var1);
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_f8,dataset);
      }
      local_a8 = local_f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_b0 = &this->m_schema;
        pbVar6 = local_f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          pcVar3 = (pbVar6->_M_dataplus)._M_p;
          local_a0 = pbVar6;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,pcVar3,pcVar3 + pbVar6->_M_string_length);
          p_Var8 = (this->m_schema)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
                  ::find(&local_b0->_M_t,&local_140);
          lVar9 = 0;
          while (p_Var8 != cVar7._M_node) {
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
            lVar9 = lVar9 + 1;
          }
          std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>::
          vector(&local_48,
                 (vector<database::ComparableString,_std::allocator<database::ComparableString>_> *)
                 (lVar9 * 0x18 +
                 *(long *)&(((this->m_data)._M_t.
                             super___uniq_ptr_impl<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_*,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_*,_false>
                            ._M_head_impl)->
                           super__Vector_base<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>
                           )._M_impl));
          plVar4 = plStack_d0;
          local_68.
          super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.
          super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68.
          super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (plVar10 = local_d8; plVar10 != plVar4; plVar10 = plVar10 + 1) {
            ComparableString::ComparableString
                      (&local_120,
                       local_48.
                       super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>
                       ._M_impl.super__Vector_impl_data._M_start + *plVar10);
            std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>::
            emplace_back<database::ComparableString>(&local_68,&local_120);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120.m_string._M_dataplus._M_p != &local_120.m_string.field_2) {
              operator_delete(local_120.m_string._M_dataplus._M_p,
                              local_120.m_string.field_2._M_allocated_capacity + 1);
            }
          }
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
                                  *)local_98,&local_140);
          std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>::
          operator=(this_00,&local_68);
          std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>::
          ~vector(&local_68);
          std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>::
          ~vector(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
          pbVar6 = local_a0 + 1;
        } while (pbVar6 != local_a8);
      }
      if (*(long *)(local_b8 + 1) != 0) {
        (**(code **)(local_b8->_M_pod_data + 0x18))
                  (local_b8,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
                             *)local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_f8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
                     *)local_98);
        if (local_d8 != (long *)0x0) {
          operator_delete(local_d8,local_c8 - (long)local_d8);
        }
        return;
      }
      std::__throw_bad_function_call();
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"One or more of requested columns are not present in schema");
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Select attempted with invalid column identifiers");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void database::Container::_SelectRawDataSetWithCriteria(const database::impl_filter_type& filter_criteria,const std::vector<std::string>& dataset,const std::function<void(const database::impl_dataset_type&)>& lambda) const
{
  //! Check validity of the provided key-value criteria against defined schema
  if(!database::Container::_IsValidFilterCriteriaForRawSelection(filter_criteria)) 
    throw std::runtime_error("Select attempted with invalid column identifiers");

  //! Check if the requested dataset is valid
  if(!_IsValidDataSetRequested(dataset))
    throw std::runtime_error("One or more of requested columns are not present in schema");

  //! Will have the final filtered indices for the values that match the criteria
  std::vector<size_t> primary_index_vector;

  //! Iterating over each key-value pair in the filter_criteria and filter_comparison_type
  _for_each_criteria(filter_criteria,[&](auto filter_column,auto comparison_params){

    //! This is the index of the column on which filtering must be applied
    size_t filter_column_index = std::distance(m_schema.begin(),m_schema.find(filter_column));
    database::DataType column_type = m_schema.at(filter_column);

    std::vector<size_t> secondary_index_vector;

    //! Iterating over each pair of corresponding value and respective compare_type provided in the given filter
    _for_each_comparison(comparison_params,[&](auto value,auto compare) {
      auto column = m_data -> operator[](filter_column_index);
      
      std::vector<size_t> tertiary_index_vector;

      //! Iterating over each value in the given column to check if the filter criterion is satisfied O(n^3)
      for(size_t i = 0; i < column.size(); i += 1)
      {
        switch (compare)
        {
          case equal_to: if(column[i] == value) tertiary_index_vector.emplace_back(i); break;
          case not_equal_to: if(column[i] != value) tertiary_index_vector.emplace_back(i); break;
          case greater_or_equal_to: if(column[i] >= value) tertiary_index_vector.emplace_back(i); break;
          case lesser_or_equal_to: if(column[i] <= value) tertiary_index_vector.emplace_back(i); break;
          case greater_than: if(column[i] > value) tertiary_index_vector.emplace_back(i); break;
          case lesser_than: if(column[i] < value) tertiary_index_vector.emplace_back(i); break;
        }
      }
      secondary_index_vector = _ExecuteCustomIntersection(secondary_index_vector,tertiary_index_vector,column_type);
    });
    primary_index_vector = _ExecuteCustomIntersection(primary_index_vector,secondary_index_vector,column_type);
  });

  //! Extract data with the filtered indices
  database::impl_dataset_type result; 

  std::vector<std::string> required_columns;
  if(dataset.empty())
    std::transform(m_schema.begin(),m_schema.end(),std::back_inserter(required_columns),[&](auto pair){ return pair.first; });
  else
    required_columns = dataset;

  for_each(required_columns.begin(),required_columns.end(),[&](auto column_name) {
    size_t column_index = std::distance(m_schema.begin(),m_schema.find(column_name));
    auto column = m_data -> operator[](column_index);

    std::vector<database::ComparableString> data_buffer;
    std::transform(primary_index_vector.begin(),primary_index_vector.end(),std::back_inserter(data_buffer),[&](auto index) {
      return column[index];
    });
    result[column_name] = data_buffer;
  });
  lambda(result);
}